

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_allEqual_bvec2(ShaderEvalContext *c)

{
  float fVar1;
  ulong uVar2;
  int i;
  long lVar3;
  bool bVar4;
  Vector<bool,_2> res_1;
  Vector<bool,_2> res;
  float local_20 [6];
  ulong local_8;
  
  local_20[0] = c->in[0].m_data[3];
  local_20[1] = c->in[0].m_data[1];
  local_20[4] = 0.0;
  local_20[5] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  lVar3 = 0;
  do {
    res.m_data[lVar3] =
         local_20[lVar3 + 4] <= local_20[lVar3] && local_20[lVar3] != local_20[lVar3 + 4];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  uVar2 = *(ulong *)c->in[1].m_data;
  local_8 = uVar2 << 0x20 | uVar2 >> 0x20;
  local_20[2] = 0.0;
  local_20[3] = 0.0;
  res_1.m_data[0] = false;
  res_1.m_data[1] = false;
  lVar3 = 0;
  do {
    fVar1 = *(float *)((long)&local_8 + lVar3 * 4);
    res_1.m_data[lVar3] = local_20[lVar3 + 2] <= fVar1 && fVar1 != local_20[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  bVar4 = true;
  lVar3 = 0;
  do {
    if (bVar4) {
      bVar4 = res.m_data[lVar3] == res_1.m_data[lVar3];
    }
    else {
      bVar4 = false;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  (c->color).m_data[0] = (float)bVar4;
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }